

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void nullcPrintVariableInfo(ExternTypeInfo *type,char *ptr,uint indentDepth)

{
  SubCategory SVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = nullcDebugSymbols((uint *)0x0);
  pcVar3 = pcVar3 + type->offsetToName;
  iVar2 = strcmp(pcVar3,"typeid");
  if (iVar2 != 0) {
    iVar2 = strcmp(pcVar3,"auto ref");
    if (iVar2 == 0) {
      nullcPrintAutoInfo(ptr,indentDepth);
      return;
    }
    iVar2 = strcmp(pcVar3,"auto[]");
    if (iVar2 == 0) {
      nullcPrintAutoArrayInfo(ptr,indentDepth);
      return;
    }
    SVar1 = type->subCat;
    if (SVar1 == CAT_CLASS) {
      nullcPrintComplexVariableInfo(type,ptr,indentDepth);
      return;
    }
    if (SVar1 == CAT_FUNCTION) {
      nullcPrintFunctionPointerInfo(type,ptr,indentDepth);
      return;
    }
    if (SVar1 == CAT_ARRAY) {
      nullcPrintArrayVariableInfo(type,ptr,indentDepth);
      return;
    }
  }
  return;
}

Assistant:

void nullcPrintVariableInfo(const ExternTypeInfo& type, char* ptr, unsigned indentDepth)
{
	char *codeSymbols = nullcDebugSymbols(NULL);

	if(strcmp(codeSymbols + type.offsetToName, "typeid") == 0)
		return;

	if(strcmp(codeSymbols + type.offsetToName, "auto ref") == 0)
	{
		nullcPrintAutoInfo(ptr, indentDepth);
		return;
	}
	if(strcmp(codeSymbols + type.offsetToName, "auto[]") == 0)
	{
		nullcPrintAutoArrayInfo(ptr, indentDepth);
		return;
	}

	switch(type.subCat)
	{
	case ExternTypeInfo::CAT_NONE:
		break;
	case ExternTypeInfo::CAT_ARRAY:
		nullcPrintArrayVariableInfo(type, ptr, indentDepth);
		break;
	case ExternTypeInfo::CAT_POINTER:
		break;
	case ExternTypeInfo::CAT_FUNCTION:
		nullcPrintFunctionPointerInfo(type, ptr, indentDepth);
		break;
	case ExternTypeInfo::CAT_CLASS:
		nullcPrintComplexVariableInfo(type, ptr, indentDepth);
		break;
	}
}